

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

int __thiscall bhf::ads::RegistryAccess::Export(RegistryAccess *this,string *firstKey,ostream *os)

{
  pointer pRVar1;
  _List_node_base *__position;
  ostream *poVar2;
  RegistryEntry *value;
  pointer pRVar3;
  initializer_list<bhf::ads::RegistryEntry> __l;
  vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> local_98;
  value_type key;
  list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_> pendingKeys;
  
  poVar2 = std::operator<<(os,"Windows Registry Editor Version 5.00");
  std::operator<<(poVar2,"\n");
  RegistryEntry::Create(&key,firstKey);
  __l._M_len = 1;
  __l._M_array = &key;
  std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::list
            (&pendingKeys,__l,(allocator_type *)&local_98);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  while( true ) {
    if (pendingKeys.
        super__List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>._M_impl.
        _M_node.super__List_node_base._M_next == (_List_node_base *)&pendingKeys) break;
    RegistryEntry::RegistryEntry
              (&key,(RegistryEntry *)
                    (pendingKeys.
                     super__List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                     ._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::pop_front
              (&pendingKeys);
    RegistryEntry::Write(&key,os);
    Enumerate(&local_98,this,&key,0xc0000000,0x800);
    pRVar1 = local_98.
             super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pRVar3 = local_98.
                  super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1)
    {
      RegistryEntry::Write(pRVar3,os);
    }
    std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
              (&local_98);
    __position = pendingKeys.
                 super__List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
    Enumerate(&local_98,this,&key,0,0x400);
    pRVar1 = local_98.
             super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pRVar3 = local_98.
                  super__Vector_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1)
    {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)pRVar3,
                 (const_iterator)
                 (pRVar3->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )key.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )key.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      key.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish
      [(long)((pRVar3->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start +
             ~(ulong)key.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start)] = '\\';
      pRVar3->keyLen =
           (size_t)(key.buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish +
                   (pRVar3->keyLen -
                   (long)key.buffer.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start));
      std::__cxx11::list<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::insert
                (&pendingKeys,(const_iterator)__position,pRVar3);
    }
    std::vector<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::~vector
              (&local_98);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
  }
  std::__cxx11::_List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>::
  _M_clear(&pendingKeys.
            super__List_base<bhf::ads::RegistryEntry,_std::allocator<bhf::ads::RegistryEntry>_>);
  std::operator<<(os,'\n');
  return 0;
}

Assistant:

int RegistryAccess::Export(const std::string& firstKey, std::ostream& os) const
{
    os << bhf::ads::WINDOWS_REGISTRY_HEADER << "\n";

    for (std::list<RegistryEntry> pendingKeys { RegistryEntry::Create(firstKey) }; !pendingKeys.empty(); ) {
        auto key = pendingKeys.front();
        pendingKeys.pop_front();
        key.Write(os);

        // First dump all the values of a key
        for (const auto& value: Enumerate(key, REGFLAG_ENUMVALUE_VTD, 0x800)) {
            value.Write(os);
        }

        // Then find all subkey and put them into a queue to omit recursion
        const auto pendingKeysFront = pendingKeys.cbegin();
        for (auto& newKey: Enumerate(key, REGFLAG_ENUMKEYS, 0x400)) {
            newKey.buffer.insert(newKey.buffer.begin(), key.buffer.cbegin(), key.buffer.cend());
            newKey.buffer[key.buffer.size() - 1] = '\\';
            newKey.keyLen += key.buffer.size();
            pendingKeys.insert(pendingKeysFront, newKey);
        }
    }
    os << '\n';
    return 0;
}